

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,Type a,Type b)

{
  Kind KVar1;
  pointer pTVar2;
  bool bVar3;
  TypeInfo *pTVar4;
  TypeInfo *pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  
  if (b.id < 7 || a.id < 7) {
    bVar8 = a.id == b.id;
  }
  else {
    pTVar4 = getTypeInfo(a);
    pTVar5 = getTypeInfo(b);
    KVar1 = pTVar4->kind;
    if (KVar1 == pTVar5->kind) {
      if (KVar1 == RefKind) {
        if ((pTVar4->field_2).ref.nullable == (pTVar5->field_2).ref.nullable) {
          bVar8 = eq(this,(HeapType)(pTVar4->field_2).ref.heapType.id,
                     (HeapType)(pTVar5->field_2).ref.heapType.id);
          return bVar8;
        }
      }
      else {
        if (KVar1 != TupleKind) {
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x8be);
        }
        pTVar7 = (pTVar4->field_2).tuple.types.
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar2 = (pTVar4->field_2).tuple.types.
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pTVar6 = (pTVar5->field_2).tuple.types.
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)pTVar2 - (long)pTVar7 ==
            (long)(pTVar5->field_2).tuple.types.
                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar6) {
          while( true ) {
            bVar8 = pTVar7 == pTVar2;
            if (bVar8) {
              return bVar8;
            }
            bVar3 = eq(this,(Type)pTVar7->id,(Type)pTVar6->id);
            if (!bVar3) break;
            pTVar7 = pTVar7 + 1;
            pTVar6 = pTVar6 + 1;
          }
          return bVar8;
        }
      }
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool RecGroupEquator::eq(Type a, Type b) const {
  if (a.isBasic() || b.isBasic()) {
    return a == b;
  }
  return eq(*getTypeInfo(a), *getTypeInfo(b));
}